

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colamd.c
# Opt level: O1

int init_rows_cols(int n_row,int n_col,Colamd_Row *Row,Colamd_Col *Col,int *A,int *p,int *stats)

{
  Colamd_Col *pCVar1;
  int *piVar2;
  int iVar3;
  anon_union_4_2_34273927_for_shared1 aVar4;
  int iVar5;
  anon_union_4_2_db423fdf_for_shared4 *paVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int *piVar11;
  long lVar12;
  bool bVar13;
  
  uVar9 = (ulong)(uint)n_col;
  if (0 < n_col) {
    paVar6 = &Col->shared4;
    uVar7 = 0;
    do {
      ((Colamd_Col *)(paVar6 + -5))->start = p[uVar7];
      iVar10 = p[uVar7 + 1];
      iVar8 = p[uVar7];
      paVar6[-4].degree_next = iVar10 - iVar8;
      if (iVar10 - iVar8 < 0) {
        stats[3] = -8;
        stats[4] = (int)uVar7;
        stats[5] = *(int *)(paVar6 + -4);
        return 0;
      }
      uVar7 = uVar7 + 1;
      *(undefined8 *)(paVar6 + -3) = 1;
      *(undefined8 *)(paVar6 + -1) = 0xffffffffffffffff;
      paVar6 = paVar6 + 6;
    } while (uVar9 != uVar7);
  }
  stats[6] = 0;
  if (0 < n_row) {
    lVar12 = 0;
    do {
      *(undefined4 *)((long)&Row->length + lVar12) = 0;
      *(undefined4 *)((long)&Row->shared2 + lVar12) = 0xffffffff;
      lVar12 = lVar12 + 0x10;
    } while ((ulong)(uint)n_row << 4 != lVar12);
  }
  if (0 < n_col) {
    uVar7 = 0;
    do {
      iVar10 = p[uVar7 + 1];
      if (p[uVar7] < iVar10) {
        piVar11 = A + p[uVar7];
        iVar8 = -1;
        do {
          iVar3 = *piVar11;
          lVar12 = (long)iVar3;
          iVar5 = (int)uVar7;
          if ((lVar12 < 0) || (n_row <= iVar3)) {
            stats[3] = -9;
            stats[4] = iVar5;
            stats[5] = iVar3;
            stats[6] = n_row;
            return 0;
          }
          if ((iVar3 <= iVar8) || (uVar7 == (uint)Row[lVar12].shared2.mark)) {
            stats[3] = 1;
            stats[4] = iVar5;
            stats[5] = iVar3;
            stats[6] = stats[6] + 1;
          }
          bVar13 = uVar7 != (uint)Row[lVar12].shared2.mark;
          pCVar1 = Col + uVar7;
          if (bVar13) {
            pCVar1 = (Colamd_Col *)(Row + lVar12);
          }
          piVar11 = piVar11 + 1;
          pCVar1->length = pCVar1->length + (uint)bVar13 * 2 + -1;
          Row[lVar12].shared2.mark = iVar5;
          iVar8 = iVar3;
        } while (piVar11 < A + iVar10);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar9);
  }
  aVar4 = *(anon_union_4_2_34273927_for_shared1 *)(p + uVar9);
  Row->start = (int)aVar4;
  Row->shared1 = aVar4;
  (Row->shared2).mark = -1;
  if (1 < n_row) {
    lVar12 = 0x10;
    do {
      iVar10 = *(int *)((long)Row + lVar12 + -0xc) + *(int *)((long)&Row[-1].start + lVar12);
      *(int *)((long)&Row->start + lVar12) = iVar10;
      *(int *)((long)&Row->shared1 + lVar12) = iVar10;
      *(undefined4 *)((long)&Row->shared2 + lVar12) = 0xffffffff;
      lVar12 = lVar12 + 0x10;
    } while ((ulong)(uint)n_row << 4 != lVar12);
  }
  if (stats[3] == 1) {
    if (0 < n_col) {
      uVar7 = 0;
      do {
        iVar10 = p[uVar7 + 1];
        if (p[uVar7] < iVar10) {
          piVar11 = A + p[uVar7];
          do {
            iVar8 = *piVar11;
            if (uVar7 != (uint)Row[iVar8].shared2.mark) {
              iVar3 = Row[iVar8].shared1.degree;
              Row[iVar8].shared1.degree = iVar3 + 1;
              A[iVar3] = (int)uVar7;
              Row[iVar8].shared2.mark = (int)uVar7;
            }
            piVar11 = piVar11 + 1;
          } while (piVar11 < A + iVar10);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar9);
    }
  }
  else if (0 < n_col) {
    uVar7 = 0;
    do {
      iVar10 = p[uVar7 + 1];
      if (p[uVar7] < iVar10) {
        piVar11 = A + p[uVar7];
        do {
          iVar8 = *piVar11;
          piVar11 = piVar11 + 1;
          iVar3 = Row[iVar8].shared1.degree;
          Row[iVar8].shared1.degree = iVar3 + 1;
          A[iVar3] = (int)uVar7;
        } while (piVar11 < A + iVar10);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar9);
  }
  if (0 < n_row) {
    lVar12 = 0;
    do {
      *(undefined4 *)((long)&Row->shared2 + lVar12) = 0;
      *(undefined4 *)((long)&Row->shared1 + lVar12) = *(undefined4 *)((long)&Row->length + lVar12);
      lVar12 = lVar12 + 0x10;
    } while ((ulong)(uint)n_row << 4 != lVar12);
  }
  if (stats[3] == 1) {
    Col->start = 0;
    *p = 0;
    if (1 < n_col) {
      uVar7 = 1;
      do {
        iVar10 = Col->length + Col->start;
        Col[1].start = iVar10;
        Col = Col + 1;
        p[uVar7] = iVar10;
        uVar7 = uVar7 + 1;
      } while (uVar9 != uVar7);
    }
    if (0 < n_row) {
      uVar9 = 0;
      do {
        if (0 < (long)Row[uVar9].length) {
          piVar11 = A + Row[uVar9].start;
          piVar2 = piVar11 + Row[uVar9].length;
          do {
            iVar10 = *piVar11;
            piVar11 = piVar11 + 1;
            iVar8 = p[iVar10];
            p[iVar10] = iVar8 + 1;
            A[iVar8] = (int)uVar9;
          } while (piVar11 < piVar2);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != (uint)n_row);
    }
  }
  return 1;
}

Assistant:

PRIVATE Int init_rows_cols	/* returns TRUE if OK, or FALSE otherwise */
(
    /* === Parameters ======================================================= */

    Int n_row,			/* number of rows of A */
    Int n_col,			/* number of columns of A */
    Colamd_Row Row [],		/* of size n_row+1 */
    Colamd_Col Col [],		/* of size n_col+1 */
    Int A [],			/* row indices of A, of size Alen */
    Int p [],			/* pointers to columns in A, of size n_col+1 */
    Int stats [COLAMD_STATS]	/* colamd statistics */ 
)
{
    /* === Local variables ================================================== */

    Int col ;			/* a column index */
    Int row ;			/* a row index */
    Int *cp ;			/* a column pointer */
    Int *cp_end ;		/* a pointer to the end of a column */
    Int *rp ;			/* a row pointer */
    Int *rp_end ;		/* a pointer to the end of a row */
    Int last_row ;		/* previous row */

    /* === Initialize columns, and check column pointers ==================== */

    for (col = 0 ; col < n_col ; col++)
    {
	Col [col].start = p [col] ;
	Col [col].length = p [col+1] - p [col] ;

	if (Col [col].length < 0)
	{
	    /* column pointers must be non-decreasing */
	    stats [COLAMD_STATUS] = COLAMD_ERROR_col_length_negative ;
	    stats [COLAMD_INFO1] = col ;
	    stats [COLAMD_INFO2] = Col [col].length ;
	    DEBUG0 (("colamd: col %d length %d < 0\n", col, Col [col].length)) ;
	    return (FALSE) ;
	}

	Col [col].shared1.thickness = 1 ;
	Col [col].shared2.score = 0 ;
	Col [col].shared3.prev = COLAMD_EMPTY ;
	Col [col].shared4.degree_next = COLAMD_EMPTY ;
    }

    /* p [0..n_col] no longer needed, used as "head" in subsequent routines */

    /* === Scan columns, compute row degrees, and check row indices ========= */

    stats [COLAMD_INFO3] = 0 ;	/* number of duplicate or unsorted row indices*/

    for (row = 0 ; row < n_row ; row++)
    {
	Row [row].length = 0 ;
	Row [row].shared2.mark = -1 ;
    }

    for (col = 0 ; col < n_col ; col++)
    {
	last_row = -1 ;

	cp = &A [p [col]] ;
	cp_end = &A [p [col+1]] ;

	while (cp < cp_end)
	{
	    row = *cp++ ;

	    /* make sure row indices within range */
	    if (row < 0 || row >= n_row)
	    {
		stats [COLAMD_STATUS] = COLAMD_ERROR_row_index_out_of_bounds ;
		stats [COLAMD_INFO1] = col ;
		stats [COLAMD_INFO2] = row ;
		stats [COLAMD_INFO3] = n_row ;
		DEBUG0 (("colamd: row %d col %d out of bounds\n", row, col)) ;
		return (FALSE) ;
	    }

	    if (row <= last_row || Row [row].shared2.mark == col)
	    {
		/* row index are unsorted or repeated (or both), thus col */
		/* is jumbled.  This is a notice, not an error condition. */
		stats [COLAMD_STATUS] = COLAMD_OK_BUT_JUMBLED ;
		stats [COLAMD_INFO1] = col ;
		stats [COLAMD_INFO2] = row ;
		(stats [COLAMD_INFO3]) ++ ;
		DEBUG1 (("colamd: row %d col %d unsorted/duplicate\n",row,col));
	    }

	    if (Row [row].shared2.mark != col)
	    {
		Row [row].length++ ;
	    }
	    else
	    {
		/* this is a repeated entry in the column, */
		/* it will be removed */
		Col [col].length-- ;
	    }

	    /* mark the row as having been seen in this column */
	    Row [row].shared2.mark = col ;

	    last_row = row ;
	}
    }

    /* === Compute row pointers ============================================= */

    /* row form of the matrix starts directly after the column */
    /* form of matrix in A */
    Row [0].start = p [n_col] ;
    Row [0].shared1.p = Row [0].start ;
    Row [0].shared2.mark = -1 ;
    for (row = 1 ; row < n_row ; row++)
    {
	Row [row].start = Row [row-1].start + Row [row-1].length ;
	Row [row].shared1.p = Row [row].start ;
	Row [row].shared2.mark = -1 ;
    }

    /* === Create row form ================================================== */

    if (stats [COLAMD_STATUS] == COLAMD_OK_BUT_JUMBLED)
    {
	/* if cols jumbled, watch for repeated row indices */
	for (col = 0 ; col < n_col ; col++)
	{
	    cp = &A [p [col]] ;
	    cp_end = &A [p [col+1]] ;
	    while (cp < cp_end)
	    {
		row = *cp++ ;
		if (Row [row].shared2.mark != col)
		{
		    A [(Row [row].shared1.p)++] = col ;
		    Row [row].shared2.mark = col ;
		}
	    }
	}
    }
    else
    {
	/* if cols not jumbled, we don't need the mark (this is faster) */
	for (col = 0 ; col < n_col ; col++)
	{
	    cp = &A [p [col]] ;
	    cp_end = &A [p [col+1]] ;
	    while (cp < cp_end)
	    {
		A [(Row [*cp++].shared1.p)++] = col ;
	    }
	}
    }

    /* === Clear the row marks and set row degrees ========================== */

    for (row = 0 ; row < n_row ; row++)
    {
	Row [row].shared2.mark = 0 ;
	Row [row].shared1.degree = Row [row].length ;
    }

    /* === See if we need to re-create columns ============================== */

    if (stats [COLAMD_STATUS] == COLAMD_OK_BUT_JUMBLED)
    {
    	DEBUG0 (("colamd: reconstructing column form, matrix jumbled\n")) ;

#ifndef NDEBUG
	/* make sure column lengths are correct */
	for (col = 0 ; col < n_col ; col++)
	{
	    p [col] = Col [col].length ;
	}
	for (row = 0 ; row < n_row ; row++)
	{
	    rp = &A [Row [row].start] ;
	    rp_end = rp + Row [row].length ;
	    while (rp < rp_end)
	    {
		p [*rp++]-- ;
	    }
	}
	for (col = 0 ; col < n_col ; col++)
	{
	    ASSERT (p [col] == 0) ;
	}
	/* now p is all zero (different than when debugging is turned off) */
#endif /* NDEBUG */

	/* === Compute col pointers ========================================= */

	/* col form of the matrix starts at A [0]. */
	/* Note, we may have a gap between the col form and the row */
	/* form if there were duplicate entries, if so, it will be */
	/* removed upon the first garbage collection */
	Col [0].start = 0 ;
	p [0] = Col [0].start ;
	for (col = 1 ; col < n_col ; col++)
	{
	    /* note that the lengths here are for pruned columns, i.e. */
	    /* no duplicate row indices will exist for these columns */
	    Col [col].start = Col [col-1].start + Col [col-1].length ;
	    p [col] = Col [col].start ;
	}

	/* === Re-create col form =========================================== */

	for (row = 0 ; row < n_row ; row++)
	{
	    rp = &A [Row [row].start] ;
	    rp_end = rp + Row [row].length ;
	    while (rp < rp_end)
	    {
		A [(p [*rp++])++] = row ;
	    }
	}
    }

    /* === Done.  Matrix is not (or no longer) jumbled ====================== */

    return (TRUE) ;
}